

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

void fiobj_hash_dealloc(FIOBJ o,_func_void_FIOBJ_void_ptr *task,void *arg)

{
  bool bVar1;
  ulong local_28;
  fio_hash____ordered_s_ *i;
  void *arg_local;
  _func_void_FIOBJ_void_ptr *task_local;
  FIOBJ o_local;
  
  local_28 = *(ulong *)((o & 0xfffffffffffffff8) + 0x20);
  while( true ) {
    bVar1 = false;
    if (local_28 != 0) {
      bVar1 = local_28 <
              (ulong)(*(long *)((o & 0xfffffffffffffff8) + 0x20) +
                     *(long *)((o & 0xfffffffffffffff8) + 0x18) * 0x18);
    }
    if (!bVar1) break;
    if (*(long *)(local_28 + 8) != 0) {
      (*task)(*(FIOBJ *)(local_28 + 0x10),arg);
    }
    fiobj_free(*(FIOBJ *)(local_28 + 8));
    *(undefined8 *)(local_28 + 8) = 0;
    *(undefined8 *)(local_28 + 0x10) = 0;
    local_28 = local_28 + 0x18;
  }
  *(undefined8 *)((o & 0xfffffffffffffff8) + 8) = 0;
  fio_hash___free((fio_hash___s *)((o & 0xfffffffffffffff8) + 8));
  fio_free((void *)(o & 0xfffffffffffffff8));
  return;
}

Assistant:

static void fiobj_hash_dealloc(FIOBJ o, void (*task)(FIOBJ, void *),
                               void *arg) {
  FIO_SET_FOR_LOOP(&obj2hash(o)->hash, i) {
    if (i->obj.key)
      task((FIOBJ)i->obj.obj, arg);
    fiobj_free((FIOBJ)i->obj.key);
    i->obj.key = FIOBJ_INVALID;
    i->obj.obj = FIOBJ_INVALID;
  }
  obj2hash(o)->hash.count = 0;
  fio_hash___free(&obj2hash(o)->hash);
  fio_free(FIOBJ2PTR(o));
}